

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::Instance::CallInitFunc
          (Instance *this,Store *store,Ref func_ref,Value *result,Ptr *out_trap)

{
  u64 uVar1;
  Func *pFVar2;
  int iVar3;
  Enum EVar4;
  Values results;
  Thread thread;
  u64 *local_108;
  long lStack_100;
  long local_f8;
  RefPtr<wabt::interp::Func> local_f0;
  void *local_d8;
  undefined8 uStack_d0;
  long local_c8;
  Thread local_b8;
  
  local_108 = (u64 *)0x0;
  lStack_100 = 0;
  local_f8 = 0;
  RefPtr<wabt::interp::Func>::RefPtr(&local_f0,store,func_ref);
  pFVar2 = local_f0.obj_;
  local_c8 = 0;
  local_d8 = (void *)0x0;
  uStack_d0 = 0;
  Thread::Thread(&local_b8,store,(Stream *)0x0);
  iVar3 = (*(pFVar2->super_Extern).super_Object._vptr_Object[5])
                    (pFVar2,&local_b8,&local_d8,&local_108,out_trap);
  Thread::~Thread(&local_b8);
  if (local_d8 != (void *)0x0) {
    operator_delete(local_d8,local_c8 - (long)local_d8);
  }
  EVar4 = Error;
  if (iVar3 != 1) {
    if (lStack_100 - (long)local_108 != 0x10) {
      __assert_fail("results.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp.cc"
                    ,0x2aa,
                    "Result wabt::interp::Instance::CallInitFunc(Store &, const Ref, Value *, Trap::Ptr *)"
                   );
    }
    uVar1 = local_108[1];
    (result->field_0).i64_ = *local_108;
    *(u64 *)((long)&result->field_0 + 8) = uVar1;
    EVar4 = Ok;
  }
  if (local_f0.obj_ != (Func *)0x0) {
    Store::DeleteRoot(local_f0.store_,local_f0.root_index_);
  }
  if (local_108 != (u64 *)0x0) {
    operator_delete(local_108,local_f8 - (long)local_108);
  }
  return (Result)EVar4;
}

Assistant:

Result Instance::CallInitFunc(Store& store,
                              const Ref func_ref,
                              Value* result,
                              Trap::Ptr* out_trap) {
  Values results;
  Func::Ptr func{store, func_ref};
  if (Failed(func->Call(store, {}, results, out_trap))) {
    return Result::Error;
  }
  assert(results.size() == 1);
  *result = results[0];
  return Result::Ok;
}